

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall luna::State::State(State *this)

{
  StringPool *this_00;
  GC *pGVar1;
  Table *pTVar2;
  ModuleManager *this_01;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68 [2];
  type root;
  
  *(undefined8 *)
   ((long)&(this->string_pool_)._M_t.
           super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
           super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
           super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->gc_)._M_t.super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
           super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
           super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl + 4) = 0;
  (this->module_manager_)._M_t.
  super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>._M_t.
  super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>.
  super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl = (ModuleManager *)0x0;
  (this->string_pool_)._M_t.
  super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
  super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
  super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl = (StringPool *)0x0;
  Stack::Stack(&this->stack_);
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->calls_;
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->calls_;
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  _M_size = 0;
  (this->global_).field_0.obj_ = (GCObject *)0x0;
  (this->global_).type_ = ValueT_Nil;
  this_00 = (StringPool *)operator_new(0x70);
  StringPool::StringPool(this_00);
  std::__uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>::reset
            ((__uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_> *)
             &this->string_pool_,this_00);
  pGVar1 = (GC *)operator_new(0x2e0);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(luna::GCObject_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp:22:26)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(luna::GCObject_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp:22:26)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  GC::GC(pGVar1,(GCObjectDeleter *)&local_88,false);
  std::__uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>::reset
            ((__uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_> *)&this->gc_,pGVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  root._M_f = (offset_in_State_to_subr)FullGCRoot;
  root._8_8_ = 0;
  pGVar1 = (this->gc_)._M_t.super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
           super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
           super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl;
  root._M_bound_args.super__Tuple_impl<0UL,_luna::State_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_luna::State_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_luna::State_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_luna::State_*,_std::_Placeholder<1>_>)this;
  std::function<void(luna::GCObjectVisitor*)>::
  function<std::_Bind<void(luna::State::*(luna::State*,std::_Placeholder<1>))(luna::GCObjectVisitor*)>&,void>
            ((function<void(luna::GCObjectVisitor*)> *)local_88._M_pod_data,&root);
  std::function<void(luna::GCObjectVisitor*)>::
  function<std::_Bind<void(luna::State::*(luna::State*,std::_Placeholder<1>))(luna::GCObjectVisitor*)>&,void>
            ((function<void(luna::GCObjectVisitor*)> *)local_68[0]._M_pod_data,&root);
  GC::SetRootTraveller(pGVar1,(RootTravelType *)&local_88,(RootTravelType *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  pTVar2 = NewTable(this);
  (this->global_).field_0.table_ = pTVar2;
  (this->global_).type_ = ValueT_Table;
  local_88._8_4_ = 4;
  local_88._M_unused._M_object = GetString(this,"__metatables");
  local_68[0]._8_4_ = 7;
  local_68[0]._0_8_ = NewTable(this);
  Table::SetValue((this->global_).field_0.table_,(Value *)&local_88,(Value *)local_68);
  local_88._8_4_ = 4;
  local_88._M_unused._M_object = GetString(this,"__modules");
  local_68[0]._8_4_ = 7;
  local_68[0]._0_8_ = NewTable(this);
  Table::SetValue((this->global_).field_0.table_,(Value *)&local_88,(Value *)local_68);
  this_01 = (ModuleManager *)operator_new(0x10);
  ModuleManager::ModuleManager(this_01,this,(Table *)local_68[0]._0_8_);
  std::__uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>::reset
            ((__uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_> *)this
             ,this_01);
  return;
}

Assistant:

State::State()
    {
        string_pool_.reset(new StringPool);

        // Init GC
        gc_.reset(new GC([&](GCObject *obj, unsigned int type) {
            if (type == GCObjectType_String)
            {
                string_pool_->DeleteString(static_cast<String *>(obj));
            }
            delete obj;
        }));
        auto root = std::bind(&State::FullGCRoot, this, std::placeholders::_1);
        gc_->SetRootTraveller(root, root);

        // New global table
        global_.table_ = NewTable();
        global_.type_ = ValueT_Table;

        // New table for store metatables
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(METATABLES);
        Value v;
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // New table for store modules
        k.type_ = ValueT_String;
        k.str_ = GetString(MODULES_TABLE);
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // Init module manager
        module_manager_.reset(new ModuleManager(this, v.table_));
    }